

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O2

int mbedtls_x509_crt_verify_with_profile
              (mbedtls_x509_crt *crt,mbedtls_x509_crt *trust_ca,mbedtls_x509_crl *ca_crl,
              mbedtls_x509_crt_profile *profile,char *cn,uint32_t *flags,
              _func_int_void_ptr_mbedtls_x509_crt_ptr_int_uint32_t_ptr *f_vrfy,void *p_vrfy)

{
  ulong uVar1;
  int iVar2;
  mbedtls_pk_type_t pk_alg;
  size_t len;
  mbedtls_x509_buf *name;
  mbedtls_x509_crt *parent;
  mbedtls_x509_crt *parent_00;
  mbedtls_asn1_named_data *pmVar3;
  
  if (profile == (mbedtls_x509_crt_profile *)0x0) {
    return -0x2800;
  }
  *flags = 0;
  if (cn != (char *)0x0) {
    len = strlen(cn);
    if ((crt->ext_types & 0x20) == 0) {
      for (pmVar3 = &crt->subject; pmVar3 != (mbedtls_asn1_named_data *)0x0; pmVar3 = pmVar3->next)
      {
        if ((((pmVar3->oid).len == 3) && (iVar2 = bcmp("U\x04\x03",(pmVar3->oid).p,3), iVar2 == 0))
           && (((uVar1 = (pmVar3->val).len, uVar1 == len &&
                (iVar2 = x509_memcasecmp((pmVar3->val).p,cn,len), iVar2 == 0)) ||
               (((2 < uVar1 && (*(short *)(pmVar3->val).p == 0x2e2a)) &&
                (iVar2 = x509_check_wildcard(cn,&pmVar3->val), iVar2 == 0)))))) goto LAB_00113a7a;
      }
    }
    else {
      for (name = &(crt->subject_alt_names).buf; name != (mbedtls_x509_buf *)0x0;
          name = *(mbedtls_x509_buf **)(name + 1)) {
        uVar1 = name->len;
        if (((uVar1 == len) && (iVar2 = x509_memcasecmp(cn,name->p,len), iVar2 == 0)) ||
           ((2 < uVar1 &&
            ((*(short *)name->p == 0x2e2a && (iVar2 = x509_check_wildcard(cn,name), iVar2 == 0))))))
        goto LAB_00113a7a;
      }
    }
    *flags = 4;
  }
LAB_00113a7a:
  pk_alg = mbedtls_pk_get_type(&crt->pk);
  if ((profile->allowed_pks >> ((byte)((char)pk_alg - 1) & 0x1f) & 1) == 0) {
    *(byte *)((long)flags + 1) = *(byte *)((long)flags + 1) | 0x80;
  }
  iVar2 = x509_profile_check_key(profile,pk_alg,&crt->pk);
  parent = trust_ca;
  if (iVar2 != 0) {
    *(byte *)((long)flags + 2) = *(byte *)((long)flags + 2) | 1;
  }
  for (; parent_00 = crt, parent != (mbedtls_x509_crt *)0x0; parent = parent->next) {
    iVar2 = x509_crt_check_parent(crt,parent,0,1);
    if (iVar2 == 0) goto LAB_00113b60;
  }
  do {
    parent_00 = parent_00->next;
    parent = trust_ca;
    if (parent_00 == (mbedtls_x509_crt *)0x0) goto LAB_00113b60;
    iVar2 = x509_crt_check_parent(crt,parent_00,0,1);
  } while (iVar2 != 0);
  iVar2 = x509_crt_verify_child(crt,parent_00,trust_ca,ca_crl,profile,0,0,flags,f_vrfy,p_vrfy);
LAB_00113b7b:
  if ((iVar2 == 0) && (iVar2 = -0x2700, *flags == 0)) {
    iVar2 = 0;
  }
  return iVar2;
LAB_00113b60:
  iVar2 = x509_crt_verify_top(crt,parent,ca_crl,profile,0,0,flags,f_vrfy,p_vrfy);
  goto LAB_00113b7b;
}

Assistant:

int mbedtls_x509_crt_verify_with_profile( mbedtls_x509_crt *crt,
                     mbedtls_x509_crt *trust_ca,
                     mbedtls_x509_crl *ca_crl,
                     const mbedtls_x509_crt_profile *profile,
                     const char *cn, uint32_t *flags,
                     int (*f_vrfy)(void *, mbedtls_x509_crt *, int, uint32_t *),
                     void *p_vrfy )
{
    size_t cn_len;
    int ret;
    int pathlen = 0, selfsigned = 0;
    mbedtls_x509_crt *parent;
    mbedtls_x509_name *name;
    mbedtls_x509_sequence *cur = NULL;
    mbedtls_pk_type_t pk_type;

    if( profile == NULL )
        return( MBEDTLS_ERR_X509_BAD_INPUT_DATA );

    *flags = 0;

    if( cn != NULL )
    {
        name = &crt->subject;
        cn_len = strlen( cn );

        if( crt->ext_types & MBEDTLS_X509_EXT_SUBJECT_ALT_NAME )
        {
            cur = &crt->subject_alt_names;

            while( cur != NULL )
            {
                if( cur->buf.len == cn_len &&
                    x509_memcasecmp( cn, cur->buf.p, cn_len ) == 0 )
                    break;

                if( cur->buf.len > 2 &&
                    memcmp( cur->buf.p, "*.", 2 ) == 0 &&
                    x509_check_wildcard( cn, &cur->buf ) == 0 )
                {
                    break;
                }

                cur = cur->next;
            }

            if( cur == NULL )
                *flags |= MBEDTLS_X509_BADCERT_CN_MISMATCH;
        }
        else
        {
            while( name != NULL )
            {
                if( MBEDTLS_OID_CMP( MBEDTLS_OID_AT_CN, &name->oid ) == 0 )
                {
                    if( name->val.len == cn_len &&
                        x509_memcasecmp( name->val.p, cn, cn_len ) == 0 )
                        break;

                    if( name->val.len > 2 &&
                        memcmp( name->val.p, "*.", 2 ) == 0 &&
                        x509_check_wildcard( cn, &name->val ) == 0 )
                        break;
                }

                name = name->next;
            }

            if( name == NULL )
                *flags |= MBEDTLS_X509_BADCERT_CN_MISMATCH;
        }
    }

    /* Check the type and size of the key */
    pk_type = mbedtls_pk_get_type( &crt->pk );

    if( x509_profile_check_pk_alg( profile, pk_type ) != 0 )
        *flags |= MBEDTLS_X509_BADCERT_BAD_PK;

    if( x509_profile_check_key( profile, pk_type, &crt->pk ) != 0 )
        *flags |= MBEDTLS_X509_BADCERT_BAD_KEY;

    /* Look for a parent in trusted CAs */
    for( parent = trust_ca; parent != NULL; parent = parent->next )
    {
        if( x509_crt_check_parent( crt, parent, 0, pathlen == 0 ) == 0 )
            break;
    }

    if( parent != NULL )
    {
        ret = x509_crt_verify_top( crt, parent, ca_crl, profile,
                                   pathlen, selfsigned, flags, f_vrfy, p_vrfy );
        if( ret != 0 )
            return( ret );
    }
    else
    {
        /* Look for a parent upwards the chain */
        for( parent = crt->next; parent != NULL; parent = parent->next )
            if( x509_crt_check_parent( crt, parent, 0, pathlen == 0 ) == 0 )
                break;

        /* Are we part of the chain or at the top? */
        if( parent != NULL )
        {
            ret = x509_crt_verify_child( crt, parent, trust_ca, ca_crl, profile,
                                         pathlen, selfsigned, flags, f_vrfy, p_vrfy );
            if( ret != 0 )
                return( ret );
        }
        else
        {
            ret = x509_crt_verify_top( crt, trust_ca, ca_crl, profile,
                                       pathlen, selfsigned, flags, f_vrfy, p_vrfy );
            if( ret != 0 )
                return( ret );
        }
    }

    if( *flags != 0 )
        return( MBEDTLS_ERR_X509_CERT_VERIFY_FAILED );

    return( 0 );
}